

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O0

Result_t * __thiscall
Kumu::ByteString::Append
          (Result_t *__return_storage_ptr__,ByteString *this,byte_t *buf,ui32_t buf_len)

{
  int iVar1;
  Result_t local_98;
  uint local_2c;
  undefined1 local_25;
  ui32_t diff;
  byte_t *pbStack_20;
  ui32_t buf_len_local;
  byte_t *buf_local;
  ByteString *this_local;
  Result_t *result;
  
  local_25 = 0;
  diff = buf_len;
  pbStack_20 = buf;
  buf_local = (byte_t *)this;
  this_local = (ByteString *)__return_storage_ptr__;
  Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_OK);
  local_2c = this->m_Capacity - this->m_Length;
  if (local_2c < diff) {
    Capacity(&local_98,this,this->m_Capacity + diff);
    Result_t::operator=(__return_storage_ptr__,&local_98);
    Result_t::~Result_t(&local_98);
  }
  iVar1 = Result_t::operator_cast_to_int(__return_storage_ptr__);
  if (-1 < iVar1) {
    memcpy(this->m_Data + this->m_Length,pbStack_20,(ulong)diff);
    this->m_Length = diff + this->m_Length;
  }
  return __return_storage_ptr__;
}

Assistant:

Kumu::Result_t
Kumu::ByteString::Append(const byte_t* buf, ui32_t buf_len)
{
  Result_t result = RESULT_OK;
  ui32_t diff = m_Capacity - m_Length;

  if ( diff < buf_len )
    result = Capacity(m_Capacity + buf_len);

  if ( KM_SUCCESS(result) )
    {
      memcpy(m_Data + m_Length, buf, buf_len);
      m_Length += buf_len;
    }

  return result;
}